

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

bound_t __thiscall tchecker::clockbounds::df_solver_t::L(df_solver_t *this,loc_id_t l,clock_id_t x)

{
  db_t *pdVar1;
  bool bVar2;
  char *pcVar3;
  
  if (this->_loc_number <= l) {
    __assert_fail("l < _loc_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd1,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  if (this->_clock_number <= x) {
    __assert_fail("x < _clock_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd2,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  if (this->_updated_L == true) {
    __assert_fail("!_updated_L",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd3,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  bVar2 = tchecker::dbm::is_empty_0(this->_L,(clock_id_t)this->_dim);
  if (!bVar2) {
    pdVar1 = this->_L;
    pcVar3 = index(this,(char *)(ulong)l,x);
    return -((int)pdVar1[(long)pcVar3] >> 1);
  }
  __assert_fail("!tchecker::dbm::is_empty_0(_L, _dim)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                ,0xd4,
                "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
               );
}

Assistant:

tchecker::clockbounds::bound_t df_solver_t::L(tchecker::loc_id_t l, tchecker::clock_id_t x) const
{
  assert(l < _loc_number);
  assert(x < _clock_number);
  assert(!_updated_L);
  assert(!tchecker::dbm::is_empty_0(_L, _dim));
  tchecker::dbm::db_t db = _L[0 * _dim + index(l, x)];
  return (db == tchecker::dbm::LT_INFINITY ? tchecker::clockbounds::NO_BOUND : -tchecker::dbm::value(db));
}